

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

wchar_t archive_write_add_filter_compress(archive *_a)

{
  int iVar1;
  archive_write_filter *paVar2;
  wchar_t magic_test;
  archive_write_filter *f;
  archive_write *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  archive *in_stack_ffffffffffffffe0;
  wchar_t local_4;
  
  paVar2 = __archive_write_allocate_filter(in_stack_ffffffffffffffe0);
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    local_4 = L'\xffffffe2';
  }
  else {
    paVar2->open = archive_compressor_compress_open;
    paVar2->code = 3;
    paVar2->name = "compress";
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
archive_write_add_filter_compress(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_compress");
	f->open = &archive_compressor_compress_open;
	f->code = ARCHIVE_FILTER_COMPRESS;
	f->name = "compress";
	return (ARCHIVE_OK);
}